

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFAcroFormDocumentHelper::addFormField
          (QPDFAcroFormDocumentHelper *this,QPDFFormFieldObjectHelper *ff)

{
  bool bVar1;
  QPDFObjectHandle local_118;
  undefined1 local_108 [24];
  set visited;
  QPDFObjectHandle local_b8;
  allocator<char> local_a1;
  QPDFObjectHandle local_a0 [2];
  QPDFObjectHandle local_80 [2];
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  QPDFObjectHandle fields;
  QPDFObjectHandle acroform;
  QPDFFormFieldObjectHelper *ff_local;
  QPDFAcroFormDocumentHelper *this_local;
  
  getOrCreateAcroForm((QPDFAcroFormDocumentHelper *)
                      &fields.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/Fields",&local_59);
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)local_38,
             (string *)
             &fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_38);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"/Fields",&local_a1);
    QPDFObjectHandle::newArray();
    QPDFObjectHandle::replaceKeyAndGetNew
              (local_80,(string *)
                        &fields.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               local_a0);
    QPDFObjectHandle::operator=((QPDFObjectHandle *)local_38,local_80);
    QPDFObjectHandle::~QPDFObjectHandle(local_80);
    QPDFObjectHandle::~QPDFObjectHandle(&local_b8);
    std::__cxx11::string::~string((string *)local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  QPDFObjectHelper::getObjectHandle
            ((QPDFObjectHelper *)
             &visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t
              ._M_impl.super__Rb_tree_header._M_node_count);
  QPDFObjectHandle::appendItem
            ((QPDFObjectHandle *)local_38,
             (QPDFObjectHandle *)
             &visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t
              ._M_impl.super__Rb_tree_header._M_node_count);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t
              ._M_impl.super__Rb_tree_header._M_node_count);
  QPDFObjGen::set::set((set *)(local_108 + 0x10));
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_108);
  QPDFObjectHandle::newNull();
  traverseField(this,(QPDFObjectHandle *)local_108,&local_118,0,(set *)(local_108 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle(&local_118);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_108);
  QPDFObjGen::set::~set((set *)(local_108 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::addFormField(QPDFFormFieldObjectHelper ff)
{
    auto acroform = getOrCreateAcroForm();
    auto fields = acroform.getKey("/Fields");
    if (!fields.isArray()) {
        fields = acroform.replaceKeyAndGetNew("/Fields", QPDFObjectHandle::newArray());
    }
    fields.appendItem(ff.getObjectHandle());
    QPDFObjGen::set visited;
    traverseField(ff.getObjectHandle(), QPDFObjectHandle::newNull(), 0, visited);
}